

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O3

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalCreateARTIndex::GetLocalSinkState
          (PhysicalCreateARTIndex *this,ExecutionContext *context)

{
  ClientContext *context_00;
  _Head_base<0UL,_duckdb::BoundIndex_*,_false> _Var1;
  iterator __position;
  CreateARTIndexLocalSinkState *this_00;
  DataTable *table;
  pointer pCVar2;
  pointer pCVar3;
  TableIOManager *args_3;
  pointer pCVar4;
  Allocator *pAVar5;
  pointer pCVar6;
  pointer pBVar7;
  undefined8 *in_RDX;
  pointer pLVar8;
  initializer_list<duckdb::LogicalType> __l;
  _Head_base<0UL,_duckdb::CreateARTIndexLocalSinkState_*,_false> local_70;
  allocator_type local_61;
  vector<duckdb::LogicalType,_true> local_60;
  LogicalType local_48;
  
  context_00 = (ClientContext *)*in_RDX;
  this_00 = (CreateARTIndexLocalSinkState *)operator_new(0x148);
  CreateARTIndexLocalSinkState::CreateARTIndexLocalSinkState(this_00,context_00);
  local_70._M_head_impl = this_00;
  table = (DataTable *)
          (*(code *)((((context[5].thread)->profiler).context)->config).profiler_settings._M_h.
                    _M_buckets)();
  pCVar2 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&context[6].pipeline);
  pCVar3 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&context[6].pipeline);
  args_3 = TableIOManager::Get(table);
  make_uniq<duckdb::ART,std::__cxx11::string&,duckdb::IndexConstraintType&,duckdb::vector<unsigned_long,true>const&,duckdb::TableIOManager&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>const&,duckdb::AttachedDatabase&>
            ((duckdb *)&local_60,&pCVar2->index_name,&pCVar3->constraint_type,
             (vector<unsigned_long,_true> *)&context[5].pipeline,args_3,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)(context + 7),table->db);
  pLVar8 = local_60.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_60.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pCVar4 = unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
                         *)&local_70);
  _Var1._M_head_impl =
       (pCVar4->local_index).
       super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
       super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl;
  (pCVar4->local_index).
  super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
  super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl = (BoundIndex *)pLVar8;
  if (_Var1._M_head_impl != (BoundIndex *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_Index + 8))();
  }
  if (local_60.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)local_60.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
  }
  pCVar4 = unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
                         *)&local_70);
  ::std::vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::resize
            (&(pCVar4->keys).super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>,0x800);
  pCVar4 = unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
                         *)&local_70);
  ::std::vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::resize
            (&(pCVar4->row_ids).super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>,0x800)
  ;
  pCVar4 = unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
                         *)&local_70);
  pAVar5 = Allocator::Get((ClientContext *)*in_RDX);
  pCVar6 = unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
                         *)&local_70);
  pBVar7 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     (&pCVar6->local_index);
  DataChunk::Initialize(&pCVar4->key_chunk,pAVar5,&pBVar7->logical_types,0x800);
  pCVar4 = unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
                         *)&local_70);
  pAVar5 = Allocator::Get((ClientContext *)*in_RDX);
  LogicalType::LogicalType(&local_48,BIGINT);
  __l._M_len = 1;
  __l._M_array = &local_48;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_60,__l,
             &local_61);
  DataChunk::Initialize(&pCVar4->row_id_chunk,pAVar5,&local_60,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_60);
  LogicalType::~LogicalType(&local_48);
  pLVar8 = (pointer)0x0;
  while( true ) {
    local_60.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = pLVar8;
    pCVar4 = unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
             ::operator->((unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
                           *)&local_70);
    if ((pointer)(((long)(pCVar4->key_chunk).data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(pCVar4->key_chunk).data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) <= pLVar8)
    break;
    pCVar4 = unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
             ::operator->((unique_ptr<duckdb::CreateARTIndexLocalSinkState,_std::default_delete<duckdb::CreateARTIndexLocalSinkState>,_true>
                           *)&local_70);
    __position._M_current =
         (pCVar4->key_column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pCVar4->key_column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pCVar4->key_column_ids,
                 __position,(unsigned_long *)&local_60);
    }
    else {
      *__position._M_current =
           (unsigned_long)
           local_60.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
      (pCVar4->key_column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    pLVar8 = (pointer)&(local_60.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start)->physical_type_;
  }
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)local_70._M_head_impl;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalCreateARTIndex::GetLocalSinkState(ExecutionContext &context) const {
	// Create the local sink state and add the local index.
	auto state = make_uniq<CreateARTIndexLocalSinkState>(context.client);
	auto &storage = table.GetStorage();
	state->local_index = make_uniq<ART>(info->index_name, info->constraint_type, storage_ids,
	                                    TableIOManager::Get(storage), unbound_expressions, storage.db);

	// Initialize the local sink state.
	state->keys.resize(STANDARD_VECTOR_SIZE);
	state->row_ids.resize(STANDARD_VECTOR_SIZE);
	state->key_chunk.Initialize(Allocator::Get(context.client), state->local_index->logical_types);
	state->row_id_chunk.Initialize(Allocator::Get(context.client), vector<LogicalType> {LogicalType::ROW_TYPE});
	for (idx_t i = 0; i < state->key_chunk.ColumnCount(); i++) {
		state->key_column_ids.push_back(i);
	}
	return std::move(state);
}